

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O2

void * FIX::ThreadedSocketAcceptor::socketAcceptorThread(void *p)

{
  socket_handle s;
  ThreadedSocketAcceptor *this;
  bool bVar1;
  socket_handle s_00;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  *__x;
  ThreadedSocketConnection *this_00;
  undefined8 *var;
  ostream *poVar2;
  char *pcVar3;
  NullLog *pNVar4;
  int port;
  Mutex *local_260;
  int rcvBufSize;
  int sendBufSize;
  int noDelay;
  NullLog *local_248;
  PortToSessions *local_240;
  thread_id thread;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_218;
  Sessions sessions;
  stringstream stream;
  ostream local_1a8 [376];
  
  this = *p;
  s = *(socket_handle *)((long)p + 8);
  port = *(int *)((long)p + 0xc);
  operator_delete(p,0x10);
  noDelay = 0;
  sendBufSize = 0;
  rcvBufSize = 0;
  socket_getsockopt(s,1,&noDelay);
  socket_getsockopt(s,7,&sendBufSize);
  socket_getsockopt(s,8,&rcvBufSize);
  local_240 = &this->m_portToSessions;
  local_248 = &(this->super_Acceptor).m_nullLog;
  local_260 = &this->m_mutex;
  while( true ) {
    if (((this->super_Acceptor).m_stop._M_base._M_i & 1U) != 0) break;
    s_00 = socket_accept(s);
    if (s_00 == -1) break;
    if (noDelay != 0) {
      socket_setsockopt(s_00,1);
    }
    if (sendBufSize != 0) {
      socket_setsockopt(s_00,7,sendBufSize);
    }
    if (rcvBufSize != 0) {
      socket_setsockopt(s_00,8,rcvBufSize);
    }
    __x = &std::
           map<int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
           ::operator[](local_240,&port)->_M_t;
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::_Rb_tree(&sessions._M_t,__x);
    this_00 = (ThreadedSocketConnection *)operator_new(0x20c8);
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::_Rb_tree(&local_218,&sessions._M_t);
    pNVar4 = (NullLog *)(this->super_Acceptor).m_pLog;
    if (pNVar4 == (NullLog *)0x0) {
      pNVar4 = local_248;
    }
    ThreadedSocketConnection::ThreadedSocketConnection
              (this_00,s_00,(Sessions *)&local_218,&pNVar4->super_Log);
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::~_Rb_tree(&local_218);
    var = (undefined8 *)operator_new(0x10);
    *var = this;
    var[1] = this_00;
    Mutex::lock(local_260);
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar2 = std::operator<<(local_1a8,"Accepted connection from ");
    pcVar3 = socket_peername(s_00);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," on port ");
    std::ostream::operator<<(poVar2,port);
    pNVar4 = (NullLog *)(this->super_Acceptor).m_pLog;
    std::__cxx11::stringbuf::str();
    if (pNVar4 == (NullLog *)0x0) {
      pNVar4 = local_248;
    }
    (*(pNVar4->super_Log)._vptr_Log[6])(pNVar4,(string *)&thread);
    std::__cxx11::string::~string((string *)&thread);
    bVar1 = thread_spawn(socketConnectionThread,var,&thread);
    if (bVar1) {
      addThread(this,s_00,thread);
    }
    else {
      operator_delete(var,0x10);
      (*(this_00->super_Responder)._vptr_Responder[1])(this_00);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    Mutex::unlock(local_260);
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::~_Rb_tree(&sessions._M_t);
  }
  if (((this->super_Acceptor).m_stop._M_base._M_i & 1U) == 0) {
    removeThread(this,s);
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC ThreadedSocketAcceptor::socketAcceptorThread(void *p) {
  AcceptorThreadInfo *info = reinterpret_cast<AcceptorThreadInfo *>(p);

  ThreadedSocketAcceptor *pAcceptor = info->m_pAcceptor;
  socket_handle s = info->m_socket;
  int port = info->m_port;
  delete info;

  int noDelay = 0;
  int sendBufSize = 0;
  int rcvBufSize = 0;
  socket_getsockopt(s, TCP_NODELAY, noDelay);
  socket_getsockopt(s, SO_SNDBUF, sendBufSize);
  socket_getsockopt(s, SO_RCVBUF, rcvBufSize);

  socket_handle socket = 0;
  while ((!pAcceptor->isStopped() && (socket = socket_accept(s)) != INVALID_SOCKET_HANDLE)) {
    if (noDelay) {
      socket_setsockopt(socket, TCP_NODELAY);
    }
    if (sendBufSize) {
      socket_setsockopt(socket, SO_SNDBUF, sendBufSize);
    }
    if (rcvBufSize) {
      socket_setsockopt(socket, SO_RCVBUF, rcvBufSize);
    }

    Sessions sessions = pAcceptor->m_portToSessions[port];

    ThreadedSocketConnection *pConnection = new ThreadedSocketConnection(socket, sessions, pAcceptor->getLog());

    ConnectionThreadInfo *info = new ConnectionThreadInfo(pAcceptor, pConnection);

    {
      Locker l(pAcceptor->m_mutex);

      std::stringstream stream;
      stream << "Accepted connection from " << socket_peername(socket) << " on port " << port;

      if (pAcceptor->getLog()) {
        pAcceptor->getLog()->onEvent(stream.str());
      }

      thread_id thread;
      if (!thread_spawn(&socketConnectionThread, info, thread)) {
        delete info;
        delete pConnection;
      } else {
        pAcceptor->addThread(socket, thread);
      }
    }
  }

  if (!pAcceptor->isStopped()) {
    pAcceptor->removeThread(s);
  }

  return 0;
}